

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.hpp
# Opt level: O1

size_t bcl::heatbath::
       choose_next<std::vector<double,std::allocator<double>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (vector<double,_std::allocator<double>_> *weights,int param_2,
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *eng)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  size_t sVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = 0.0;
  for (pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 != (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    dVar6 = dVar6 + *pdVar3;
  }
  dVar7 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (eng);
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pdVar2 - (long)pdVar1 >> 3;
  if (pdVar2 != pdVar1) {
    dVar8 = 0.0;
    sVar4 = 0;
    do {
      dVar8 = dVar8 + pdVar1[sVar4];
      if (dVar6 * (dVar7 + 0.0) <= dVar8) {
        return sVar4;
      }
      sVar4 = sVar4 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != sVar4);
  }
  return lVar5 - 1;
}

Assistant:

static std::size_t choose_next(VEC const& weights, int /* present */, ENGINE& eng){
    std::uniform_real_distribution<> dist;
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double target = sum * dist(eng);
    sum = 0;
    for (std::size_t i = 0; i < weights.size(); ++i) {
      sum += weights[i];
      if (target <= sum) return i;
    }
    return weights.size() - 1;
  }